

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O0

bool __thiscall
Win32MakefileGenerator::processPrlFileBase
          (Win32MakefileGenerator *this,QString *origFile,QStringView origName,QStringView fixedBase
          ,int slashOff)

{
  long lVar1;
  QStringView fixedBase_00;
  QStringView origName_00;
  QStringView origName_01;
  bool bVar2;
  QChar QVar3;
  qsizetype qVar4;
  long n;
  storage_type_conflict *in_RDX;
  QStringView *in_RDI;
  storage_type_conflict *in_R8;
  storage_type_conflict *in_R9;
  long in_FS_OFFSET;
  QStringView QVar5;
  int in_stack_00000008;
  int off;
  int iVar6;
  undefined4 in_stack_ffffffffffffff4c;
  MakefileGenerator *in_stack_ffffffffffffff70;
  int local_7c;
  bool local_61;
  undefined6 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb6;
  int iVar7;
  storage_type_conflict *psVar8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  origName_00.m_data = in_RDX;
  origName_00.m_size = (qsizetype)in_R9;
  QVar5.m_size._6_2_ = in_stack_ffffffffffffffb6;
  QVar5.m_size._0_6_ = in_stack_ffffffffffffffb0;
  QVar5.m_data = in_R8;
  iVar6 = in_stack_00000008;
  psVar8 = in_R9;
  bVar2 = MakefileGenerator::processPrlFileBase
                    (in_stack_ffffffffffffff70,(QString *)in_RDI,origName_00,QVar5,(int)in_R9);
  if (bVar2) {
    local_61 = true;
  }
  else {
    qVar4 = QStringView::size((QStringView *)&stack0xffffffffffffffd8);
    for (local_7c = (int)qVar4; in_stack_00000008 < local_7c; local_7c = local_7c + -1) {
      QVar3 = QStringView::at((QStringView *)CONCAT44(in_stack_ffffffffffffff4c,iVar6),0x2aefe8);
      bVar2 = QChar::isDigit((QChar *)0x2aeff7);
      iVar7 = (int)psVar8;
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        n = (long)local_7c;
        qVar4 = QStringView::size((QStringView *)&stack0xffffffffffffffd8);
        if (n != qVar4) {
          QVar5 = QStringView::left(in_RDI,n);
          origName_01.m_data = in_RDX;
          origName_01.m_size = (qsizetype)in_R9;
          fixedBase_00.m_size._6_2_ = QVar3.ucs;
          fixedBase_00.m_size._0_6_ = in_stack_ffffffffffffffb0;
          fixedBase_00.m_data = in_R8;
          local_61 = MakefileGenerator::processPrlFileBase
                               ((MakefileGenerator *)QVar5.m_size,(QString *)in_RDI,origName_01,
                                fixedBase_00,iVar7);
          goto LAB_002af0b4;
        }
        break;
      }
    }
    local_61 = false;
  }
LAB_002af0b4:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_61;
}

Assistant:

bool Win32MakefileGenerator::processPrlFileBase(QString &origFile, QStringView origName,
                                                QStringView fixedBase, int slashOff)
{
    if (MakefileGenerator::processPrlFileBase(origFile, origName, fixedBase, slashOff))
        return true;
    for (int off = fixedBase.size(); off > slashOff; off--) {
        if (!fixedBase.at(off - 1).isDigit()) {
            if (off != fixedBase.size()) {
                return MakefileGenerator::processPrlFileBase(
                            origFile, origName, fixedBase.left(off), slashOff);
            }
            break;
        }
    }
    return false;
}